

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::AcceptConnection(CConnman *this,ListenSocket *hListenSocket)

{
  long lVar1;
  element_type *peVar2;
  bool bVar3;
  int *piVar4;
  Logger *this_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  _Head_base<0UL,_Sock_*,_false> local_1b8;
  socklen_t len;
  direct_or_indirect local_1a8;
  uint local_198;
  direct_or_indirect local_170;
  uint local_160;
  undefined8 local_158;
  undefined2 local_150;
  direct_or_indirect local_148;
  uint local_138;
  undefined8 local_130;
  undefined2 local_128;
  direct_or_indirect local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined2 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  direct_or_indirect local_e8;
  uint local_d8;
  undefined8 local_d0;
  undefined2 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  sockaddr_storage sockaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  len = 0x80;
  peVar2 = (hListenSocket->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Sock[8])(&local_1b8,peVar2,&sockaddr);
  CService::CService((CService *)&local_e8.indirect_contents);
  local_c0 = 100000000;
  local_b8 = 0;
  if (local_1b8._M_head_impl == (Sock *)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
      NetworkErrorString_abi_cxx11_((string *)&local_120.indirect_contents,*piVar4);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      logging_function._M_str = "AcceptConnection";
      logging_function._M_len = 0x10;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x6ae,ALL,Info,"socket error accept failed: %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_120.indirect_contents);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120.indirect_contents.indirect != &local_110) {
        operator_delete(local_120.indirect_contents.indirect,
                        CONCAT44(local_110._M_allocated_capacity._4_4_,
                                 local_110._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  else {
    bVar3 = CService::SetSockAddr((CService *)&local_e8.indirect_contents,(sockaddr *)&sockaddr);
    if (bVar3) {
      MaybeFlipIPv6toCJDNS
                ((CService *)&local_148.indirect_contents,(CService *)&local_e8.indirect_contents);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents);
      local_110._8_8_ = local_130;
      local_100 = local_128;
      local_f8 = 100000000;
      local_f0 = 0;
      if (0x10 < local_d8) {
        free(local_e8.indirect_contents.indirect);
      }
      local_e8.indirect_contents.indirect = local_120.indirect_contents.indirect;
      local_e8._8_8_ = local_120._8_8_;
      local_d8 = local_110._M_allocated_capacity._0_4_;
      local_110._M_allocated_capacity._0_4_ = 0;
      local_c0 = local_f8;
      local_b8 = local_f0;
      local_d0 = local_110._8_8_;
      local_c8 = local_100;
      if (0x10 < local_138) {
        free(local_148.indirect_contents.indirect);
        local_148.indirect_contents.indirect = (char *)0x0;
      }
    }
    else {
      this_00 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Warning);
      if (bVar3) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_00._M_len = 0x50;
        logging_function_00._M_str = "AcceptConnection";
        logging_function_00._M_len = 0x10;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x6b4,NET,Warning,
                       "Unknown socket family\n");
      }
    }
    GetBindAddress((CAddress *)&local_1a8.indirect_contents,local_1b8._M_head_impl);
    MaybeFlipIPv6toCJDNS
              ((CService *)&local_170.indirect_contents,(CService *)&local_1a8.indirect_contents);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_120.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_170.indirect_contents);
    local_110._8_8_ = local_158;
    local_100 = local_150;
    local_f8 = 100000000;
    local_f0 = 0;
    if (0x10 < local_160) {
      free(local_170.indirect_contents.indirect);
      local_170.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_198) {
      free(local_1a8.indirect_contents.indirect);
    }
    CreateNodeFromAcceptedSocket
              (this,(unique_ptr<Sock,_std::default_delete<Sock>_> *)&local_1b8,
               hListenSocket->m_permissions,(CAddress *)&local_120.indirect_contents,
               (CAddress *)&local_e8.indirect_contents);
    if (0x10 < (uint)local_110._M_allocated_capacity._0_4_) {
      free(local_120.indirect_contents.indirect);
    }
  }
  if (0x10 < local_d8) {
    free(local_e8.indirect_contents.indirect);
  }
  if (local_1b8._M_head_impl != (Sock *)0x0) {
    (*(local_1b8._M_head_impl)->_vptr_Sock[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::AcceptConnection(const ListenSocket& hListenSocket) {
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    auto sock = hListenSocket.sock->Accept((struct sockaddr*)&sockaddr, &len);
    CAddress addr;

    if (!sock) {
        const int nErr = WSAGetLastError();
        if (nErr != WSAEWOULDBLOCK) {
            LogPrintf("socket error accept failed: %s\n", NetworkErrorString(nErr));
        }
        return;
    }

    if (!addr.SetSockAddr((const struct sockaddr*)&sockaddr)) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "Unknown socket family\n");
    } else {
        addr = CAddress{MaybeFlipIPv6toCJDNS(addr), NODE_NONE};
    }

    const CAddress addr_bind{MaybeFlipIPv6toCJDNS(GetBindAddress(*sock)), NODE_NONE};

    NetPermissionFlags permission_flags = NetPermissionFlags::None;
    hListenSocket.AddSocketPermissionFlags(permission_flags);

    CreateNodeFromAcceptedSocket(std::move(sock), permission_flags, addr_bind, addr);
}